

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_dg.c
# Opt level: O2

_Bool svc_dg_control(SVCXPRT *xprt,u_int rq,void *in)

{
  _Bool _Var1;
  
  _Var1 = false;
  switch(rq) {
  case 7:
    *(uint *)in = (uint)xprt->xp_flags;
    break;
  case 8:
    xprt->xp_flags = *in;
    break;
  default:
    goto switchD_00116a58_caseD_9;
  case 0xf:
    pthread_mutex_lock((pthread_mutex_t *)&ops_lock);
    *(svc_xprt_fun_t *)in = xprt->xp_ops->xp_free_user_data;
    goto LAB_00116aa4;
  case 0x10:
    pthread_mutex_lock((pthread_mutex_t *)&ops_lock);
    xprt->xp_ops->xp_free_user_data = (svc_xprt_fun_t)in;
LAB_00116aa4:
    pthread_mutex_unlock((pthread_mutex_t *)&ops_lock);
  }
  _Var1 = true;
switchD_00116a58_caseD_9:
  return _Var1;
}

Assistant:

static bool
svc_dg_control(SVCXPRT *xprt, const u_int rq, void *in)
{
	switch (rq) {
	case SVCGET_XP_FLAGS:
		*(u_int *) in = xprt->xp_flags;
		break;
	case SVCSET_XP_FLAGS:
		xprt->xp_flags = *(u_int *) in;
		break;
	case SVCGET_XP_FREE_USER_DATA:
		mutex_lock(&ops_lock);
		*(svc_xprt_fun_t *) in = xprt->xp_ops->xp_free_user_data;
		mutex_unlock(&ops_lock);
		break;
	case SVCSET_XP_FREE_USER_DATA:
		mutex_lock(&ops_lock);
		xprt->xp_ops->xp_free_user_data = *(svc_xprt_fun_t) in;
		mutex_unlock(&ops_lock);
		break;
	default:
		return (false);
	}
	return (true);
}